

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O0

void __thiscall
HttpSession::send_lambda::operator()
          (send_lambda *this,
          message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
          *msg)

{
  bool bVar1;
  element_type *handler;
  type *in_RDI;
  shared_ptr<boost::beast::http::message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  message;
  enable_shared_from_this<HttpSession> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  offset_in_HttpSession_to_subr *handler_00;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff8c;
  basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>
  *in_stack_ffffffffffffff90;
  offset_in_HttpSession_to_subr local_20 [4];
  
  handler_00 = local_20;
  std::
  make_shared<boost::beast::http::message<false,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>,boost::beast::http::message<false,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>>
            ((message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
              *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::shared_ptr<void>::operator=
            ((shared_ptr<void> *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             (shared_ptr<boost::beast::http::message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffff58);
  handler = CLI::std::
            __shared_ptr_access<boost::beast::http::message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<boost::beast::http::message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  CLI::std::enable_shared_from_this<HttpSession>::shared_from_this(in_stack_ffffffffffffff58);
  CLI::std::
  __shared_ptr_access<boost::beast::http::message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<boost::beast::http::message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x315b00);
  bVar1 = boost::beast::http::
          message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
          ::need_eof((message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff88);
  boost::beast::
  bind_front_handler<void(HttpSession::*)(bool,boost::system::error_code,unsigned_long),std::shared_ptr<HttpSession>,bool>
            (handler_00,(shared_ptr<HttpSession> *)CONCAT17(bVar1,in_stack_ffffffffffffff60),
             (bool *)in_stack_ffffffffffffff58);
  boost::beast::http::
  async_write<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>,_boost::beast::detail::bind_front_wrapper<void_(HttpSession::*)(bool,_boost::system::error_code,_unsigned_long),_std::shared_ptr<HttpSession>,_bool>_>
            (in_stack_ffffffffffffff90,
             (message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
              *)CONCAT44(in_stack_ffffffffffffff8c,uVar2),
             (bind_front_wrapper<void_(HttpSession::*)(bool,_boost::system::error_code,_unsigned_long),_std::shared_ptr<HttpSession>,_bool>
              *)handler,in_RDI);
  boost::beast::detail::
  bind_front_wrapper<void_(HttpSession::*)(bool,_boost::system::error_code,_unsigned_long),_std::shared_ptr<HttpSession>,_bool>
  ::~bind_front_wrapper
            ((bind_front_wrapper<void_(HttpSession::*)(bool,_boost::system::error_code,_unsigned_long),_std::shared_ptr<HttpSession>,_bool>
              *)0x315b57);
  CLI::std::shared_ptr<HttpSession>::~shared_ptr((shared_ptr<HttpSession> *)0x315b61);
  CLI::std::
  shared_ptr<boost::beast::http::message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  ::~shared_ptr((shared_ptr<boost::beast::http::message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
                 *)0x315b6e);
  return;
}

Assistant:

void operator()(http::message<isRequest, Body, Fields>&& msg) const
        {
            // The lifetime of the message has to extend
            // for the duration of the async operation so
            // we use a shared_ptr to manage it.
            auto message = std::make_shared<http::message<isRequest, Body, Fields>>(std::move(msg));

            // Store a type-erased version of the shared
            // pointer in the class to keep it alive.
            self_ref.res = message;

            // Write the response
            http::async_write(self_ref.stream,
                              *message,
                              beast::bind_front_handler(&HttpSession::on_write,
                                                        self_ref.shared_from_this(),
                                                        message->need_eof()));
        }